

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# user_geometry_device.cpp
# Opt level: O3

void embree::instanceIntersectFunc(RTCIntersectFunctionNArguments *args)

{
  void *pvVar1;
  RTCRayHitN *pRVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  RTCRay xray;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  undefined8 local_28;
  float local_20;
  undefined4 local_1c;
  float local_18;
  undefined8 local_14;
  undefined4 local_c;
  
  if (*args->valid != 0) {
    pvVar1 = args->geometryUserPtr;
    pRVar2 = args->rayhit;
    fVar3 = *(float *)pRVar2;
    fVar4 = *(float *)(pRVar2 + 4);
    fVar5 = *(float *)(pRVar2 + 8);
    fStack_2c = *(float *)(pRVar2 + 0xc);
    fVar6 = *(float *)(pRVar2 + 0x10);
    fVar7 = *(float *)(pRVar2 + 0x14);
    fVar8 = *(float *)(pRVar2 + 0x18);
    local_18 = *(float *)(pRVar2 + 0x20);
    local_38 = fVar3 * *(float *)((long)pvVar1 + 0x60) +
               fVar4 * *(float *)((long)pvVar1 + 0x70) +
               fVar5 * *(float *)((long)pvVar1 + 0x80) + *(float *)((long)pvVar1 + 0x90);
    fStack_34 = fVar3 * *(float *)((long)pvVar1 + 100) +
                fVar4 * *(float *)((long)pvVar1 + 0x74) +
                fVar5 * *(float *)((long)pvVar1 + 0x84) + *(float *)((long)pvVar1 + 0x94);
    fStack_30 = fVar3 * *(float *)((long)pvVar1 + 0x68) +
                fVar4 * *(float *)((long)pvVar1 + 0x78) +
                fVar5 * *(float *)((long)pvVar1 + 0x88) + *(float *)((long)pvVar1 + 0x98);
    local_28 = CONCAT44(fVar6 * *(float *)((long)pvVar1 + 100) +
                        fVar7 * *(float *)((long)pvVar1 + 0x74) +
                        fVar8 * *(float *)((long)pvVar1 + 0x84),
                        fVar6 * *(float *)((long)pvVar1 + 0x60) +
                        fVar7 * *(float *)((long)pvVar1 + 0x70) +
                        fVar8 * *(float *)((long)pvVar1 + 0x80));
    local_20 = fVar6 * *(float *)((long)pvVar1 + 0x68) +
               fVar7 * *(float *)((long)pvVar1 + 0x78) + fVar8 * *(float *)((long)pvVar1 + 0x88);
    local_1c = 0;
    local_14 = 0xffffffff;
    local_c = 0;
    rtcTraversableForwardIntersect1
              (args,*(undefined8 *)((long)pvVar1 + 0x10),&local_38,args->geomID);
  }
  return;
}

Assistant:

RTC_SYCL_INDIRECTLY_CALLABLE void instanceIntersectFunc(const RTCIntersectFunctionNArguments* args)
{
  const int* valid = args->valid;
  void* ptr  = args->geometryUserPtr;
  RTCRayHitN* rays = (RTCRayHitN*)args->rayhit;
  
  assert(args->N == 1);
  if (!valid[0])
    return;
  
  Ray *ray = (Ray*)rays;
  const Instance* instance = (const Instance*)ptr;
  const Vec3ff ray_org = ray->org;
  const Vec3ff ray_dir = ray->dir;
  const float ray_tnear = ray->tnear();
  const float ray_tfar  = ray->tfar;

#if 0

  RTCRayQueryContext* context = args->context;
  ray->org = Vec3ff(xfmPoint (instance->world2local,ray_org));
  ray->dir = Vec3ff(xfmVector(instance->world2local,ray_dir));
  ray->tnear() = ray_tnear;
  ray->tfar  = ray_tfar;
  pushInstanceId(context, args->geomID);
  RTCIntersectArguments args;
  rtcInitIntersectArguments(&args);
  args.context = context;
  rtcTraversableIntersect1(instance->object,RTCRayHit_(*ray),&args);
  popInstanceId(context);
  const float updated_tfar = ray->tfar;
  ray->org = ray_org;
  ray->dir = ray_dir;
  ray->tfar = updated_tfar;

#else
  
  RTCRay xray;
  const Vec3fa org = xfmPoint (instance->world2local,ray_org);
  const Vec3fa dir = xfmVector(instance->world2local,ray_dir);
  xray.org_x = org.x; xray.org_y = org.y; xray.org_z = org.z;
  xray.dir_x = dir.x; xray.dir_y = dir.y; xray.dir_z = dir.z;
  xray.tnear = ray_tnear;
  xray.tfar  = ray_tfar;
  xray.time = 0.0f;
  xray.mask = -1;
  xray.id = 0;
  xray.flags = 0;
  
  rtcTraversableForwardIntersect1(args,instance->object,&xray,args->geomID);
  
#endif
}